

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::
class_<ki::protocol::net::ServerDMLSession,_ki::protocol::net::ServerSession,_ki::protocol::net::DMLSession,_PyServerDMLSession>
::class_<pybind11::multiple_inheritance>
          (class_<ki::protocol::net::ServerDMLSession,_ki::protocol::net::ServerSession,_ki::protocol::net::DMLSession,_PyServerDMLSession>
           *this,handle scope,char *name,multiple_inheritance *extra)

{
  mapped_type ptVar1;
  internals *this_00;
  mapped_type *pptVar2;
  internals *local_d0;
  type_index local_b0;
  type_index local_a8;
  internals *local_a0;
  type_map<type_info_*> *instances;
  undefined1 local_88 [8];
  type_record record;
  multiple_inheritance *extra_local;
  char *name_local;
  class_<ki::protocol::net::ServerDMLSession,_ki::protocol::net::ServerSession,_ki::protocol::net::DMLSession,_PyServerDMLSession>
  *this_local;
  handle scope_local;
  
  record._88_8_ = extra;
  detail::generic_type::generic_type(&this->super_generic_type);
  detail::type_record::type_record((type_record *)local_88);
  record.name = (char *)&ki::protocol::net::ServerDMLSession::typeinfo;
  record.type = (type_info *)0x1f0;
  record.type_size = 8;
  record.operator_new = init_instance;
  record.init_instance = dealloc;
  record.metaclass.m_ptr._0_1_ = (byte)record.metaclass.m_ptr | 8;
  local_88 = (undefined1  [8])scope.m_ptr;
  record.scope.m_ptr = (PyObject *)name;
  detail::set_operator_new<ki::protocol::net::ServerDMLSession>(local_88);
  add_base<ki::protocol::net::ServerSession,_0>((type_record *)local_88);
  instances._0_1_ = 0;
  add_base<ki::protocol::net::DMLSession,_0>((type_record *)local_88);
  instances._1_1_ = 0;
  add_base<PyServerDMLSession,_0>((type_record *)local_88);
  instances._2_1_ = 0;
  instances._3_1_ = 0;
  detail::process_attributes<pybind11::multiple_inheritance>::init
            ((process_attributes<pybind11::multiple_inheritance> *)record._88_8_,
             (EVP_PKEY_CTX *)local_88);
  detail::generic_type::initialize(&this->super_generic_type,(type_record *)local_88);
  if (((byte)record.metaclass.m_ptr >> 4 & 1) == 0) {
    local_d0 = detail::get_internals();
  }
  else {
    local_d0 = (internals *)detail::registered_local_types_cpp();
  }
  local_a0 = local_d0;
  std::type_index::type_index(&local_a8,(type_info *)&ki::protocol::net::ServerDMLSession::typeinfo)
  ;
  pptVar2 = std::
            unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
            ::operator[](&local_d0->registered_types_cpp,&local_a8);
  this_00 = local_a0;
  ptVar1 = *pptVar2;
  std::type_index::type_index(&local_b0,(type_info *)&PyServerDMLSession::typeinfo);
  pptVar2 = std::
            unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
            ::operator[](&this_00->registered_types_cpp,&local_b0);
  *pptVar2 = ptVar1;
  detail::type_record::~type_record((type_record *)local_88);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        using namespace detail;

        // MI can only be specified via class_ template options, not constructor parameters
        static_assert(
            none_of<is_pyobject<Extra>...>::value || // no base class arguments, or:
            (   constexpr_sum(is_pyobject<Extra>::value...) == 1 && // Exactly one base
                constexpr_sum(is_base<options>::value...)   == 0 && // no template option bases
                none_of<std::is_same<multiple_inheritance, Extra>...>::value), // no multiple_inheritance attr
            "Error: multiple inheritance bases must be specified via class_ template options");

        type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(conditional_t<has_alias, type_alias, type>);
        record.holder_size = sizeof(holder_type);
        record.init_instance = init_instance;
        record.dealloc = dealloc;
        record.default_holder = std::is_same<holder_type, std::unique_ptr<type>>::value;

        set_operator_new<type>(&record);

        /* Register base classes specified via template arguments to class_, if any */
        PYBIND11_EXPAND_SIDE_EFFECTS(add_base<options>(record));

        /* Process optional arguments, if any */
        process_attributes<Extra...>::init(extra..., &record);

        generic_type::initialize(record);

        if (has_alias) {
            auto &instances = record.module_local ? registered_local_types_cpp() : get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }